

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

uint8_t * get_prev_scanline(tgestate_t *state,uint8_t *addr)

{
  uint8_t *puVar1;
  ulong uVar2;
  ptrdiff_t raddr;
  uint8_t *screen;
  uint8_t *addr_local;
  tgestate_t *state_local;
  
  puVar1 = (state->speccy->screen).pixels;
  uVar2 = (long)addr - (long)puVar1;
  if ((uVar2 & 0x700) == 0) {
    if ((uVar2 & 0xff) < 0x20) {
      raddr = uVar2 - 0x20;
    }
    else {
      raddr = uVar2 + 0x6e0;
    }
  }
  else {
    raddr = uVar2 - 0x100;
  }
  return puVar1 + raddr;
}

Assistant:

uint8_t *get_prev_scanline(tgestate_t *state, uint8_t *addr)
{
  uint8_t *const screen = &state->speccy->screen.pixels[0];
  ptrdiff_t      raddr = addr - screen;

  assert(state != NULL);
  assert(addr  != NULL);

  if ((raddr & 0x0700) != 0)
  {
    // NNN bits
    // Step back one scanline.
    raddr -= 256;
  }
  else
  {
    if ((raddr & 0x00FF) < 32)
      raddr -= 32;
    else
      // Complicated.
      raddr += 0x06E0;
  }

  return screen + raddr;
}